

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall ON_PolyEdgeSegment::Read(ON_PolyEdgeSegment *this,ON_BinaryArchive *archive)

{
  ON_Interval proxy_curve_subdomain;
  ON_Interval domain;
  bool bVar1;
  undefined1 local_50 [8];
  ON_Interval real_curve_domain;
  ON_Interval this_domain;
  int local_28;
  bool bReversed;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_PolyEdgeSegment *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  Init(this);
  iStack_24 = 0;
  local_28 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,&local_28);
  if (bVar1) {
    this_domain.m_t[1]._7_1_ = iStack_24 == 1;
    if (((((bool)this_domain.m_t[1]._7_1_) &&
         (this_domain.m_t[1]._7_1_ = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_object_id),
         (bool)this_domain.m_t[1]._7_1_)) &&
        (this_domain.m_t[1]._7_1_ =
              ON_BinaryArchive::ReadComponentIndex(_minor_version,&this->m_component_index),
        (bool)this_domain.m_t[1]._7_1_)) &&
       ((this_domain.m_t[1]._7_1_ =
              ON_BinaryArchive::ReadInterval(_minor_version,&this->m_edge_domain),
        (bool)this_domain.m_t[1]._7_1_ &&
        (this_domain.m_t[1]._7_1_ =
              ON_BinaryArchive::ReadInterval(_minor_version,&this->m_trim_domain),
        (bool)this_domain.m_t[1]._7_1_)))) {
      this_domain.m_t[1]._6_1_ = 0;
      this_domain.m_t[1]._7_1_ =
           ON_BinaryArchive::ReadBool(_minor_version,(bool *)((long)this_domain.m_t + 0xe));
      if ((bool)this_domain.m_t[1]._7_1_) {
        ON_Interval::ON_Interval((ON_Interval *)(real_curve_domain.m_t + 1));
        this_domain.m_t[1]._7_1_ =
             ON_BinaryArchive::ReadInterval
                       (_minor_version,(ON_Interval *)(real_curve_domain.m_t + 1));
        if ((bool)this_domain.m_t[1]._7_1_) {
          ON_Interval::ON_Interval((ON_Interval *)local_50);
          this_domain.m_t[1]._7_1_ =
               ON_BinaryArchive::ReadInterval(_minor_version,(ON_Interval *)local_50);
          if ((bool)this_domain.m_t[1]._7_1_) {
            if ((this_domain.m_t[1]._6_1_ & 1) != 0) {
              ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
            }
            domain.m_t[1] = this_domain.m_t[0];
            domain.m_t[0] = real_curve_domain.m_t[1];
            ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,domain);
            proxy_curve_subdomain.m_t[1] = real_curve_domain.m_t[0];
            proxy_curve_subdomain.m_t[0] = (double)local_50;
            ON_CurveProxy::SetProxyCurveDomain(&this->super_ON_CurveProxy,proxy_curve_subdomain);
          }
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      this_domain.m_t[1]._7_1_ = 0;
    }
    this_local._7_1_ = (bool)(this_domain.m_t[1]._7_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyEdgeSegment::Read( ON_BinaryArchive& archive )
{
  Init();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;
  for(;;)
  {
    rc = (1 == major_version);
    if ( !rc )
      break;

    rc = archive.ReadUuid(m_object_id);
    if (!rc) break;
    rc = archive.ReadComponentIndex(m_component_index);
    if (!rc) break;
    rc = archive.ReadInterval(m_edge_domain);
    if (!rc) break;
    rc = archive.ReadInterval(m_trim_domain);
    if (!rc) break;

    // Read ON_ProxyCurve values we need
    bool bReversed = false;
    rc = archive.ReadBool(&bReversed);
    if (!rc) break;
    ON_Interval this_domain;
    rc = archive.ReadInterval(this_domain);
    if (!rc) break;
    ON_Interval real_curve_domain;
    rc = archive.ReadInterval(real_curve_domain);
    if (!rc) break;

    if ( bReversed)
      ON_CurveProxy::Reverse();
    ON_CurveProxy::SetDomain(this_domain);
    ON_CurveProxy::SetProxyCurveDomain(real_curve_domain);

    break;
  }
  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}